

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls1_check_group_id(SSL_HANDSHAKE *hs,uint16_t group_id)

{
  bool bVar1;
  uint16_t uVar2;
  iterator puVar3;
  uint16_t supported;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_short> *local_28;
  Span<const_unsigned_short> *__range1;
  SSL_HANDSHAKE *pSStack_18;
  uint16_t group_id_local;
  SSL_HANDSHAKE *hs_local;
  
  __range1._6_2_ = group_id;
  pSStack_18 = hs;
  bVar1 = is_post_quantum_group(group_id);
  if (((!bVar1) || (uVar2 = ssl_protocol_version(pSStack_18->ssl), 0x303 < uVar2)) &&
     (__range1._6_2_ != 0)) {
    ___begin1 = tls1_get_grouplist(pSStack_18);
    local_28 = (Span<const_unsigned_short> *)&__begin1;
    __end1 = Span<const_unsigned_short>::begin(local_28);
    puVar3 = Span<const_unsigned_short>::end(local_28);
    for (; __end1 != puVar3; __end1 = __end1 + 1) {
      if (*__end1 == __range1._6_2_) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool tls1_check_group_id(const SSL_HANDSHAKE *hs, uint16_t group_id) {
  if (is_post_quantum_group(group_id) &&
      ssl_protocol_version(hs->ssl) < TLS1_3_VERSION) {
    // Post-quantum "groups" require TLS 1.3.
    return false;
  }

  // We internally assume zero is never allocated as a group ID.
  if (group_id == 0) {
    return false;
  }

  for (uint16_t supported : tls1_get_grouplist(hs)) {
    if (supported == group_id) {
      return true;
    }
  }

  return false;
}